

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_check_magic.c
# Opt level: O0

char * state_name(uint s)

{
  char *pcStack_10;
  uint s_local;
  
  if (s == 1) {
    pcStack_10 = "new";
  }
  else if (s == 2) {
    pcStack_10 = "header";
  }
  else if (s == 4) {
    pcStack_10 = "data";
  }
  else if (s == 0x10) {
    pcStack_10 = "eof";
  }
  else if (s == 0x20) {
    pcStack_10 = "closed";
  }
  else if (s == 0x8000) {
    pcStack_10 = "fatal";
  }
  else {
    pcStack_10 = "??";
  }
  return pcStack_10;
}

Assistant:

static const char *
state_name(unsigned s)
{
	switch (s) {
	case ARCHIVE_STATE_NEW:		return ("new");
	case ARCHIVE_STATE_HEADER:	return ("header");
	case ARCHIVE_STATE_DATA:	return ("data");
	case ARCHIVE_STATE_EOF:		return ("eof");
	case ARCHIVE_STATE_CLOSED:	return ("closed");
	case ARCHIVE_STATE_FATAL:	return ("fatal");
	default:			return ("??");
	}
}